

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O3

MCode * lj_mcode_reserve(jit_State *J,MCode **lim)

{
  if (J->mcarea == (MCode *)0x0) {
    mcode_allocarea(J);
  }
  else {
    mcode_protect(J,3);
  }
  *lim = J->mcbot;
  return J->mctop;
}

Assistant:

MCode *lj_mcode_reserve(jit_State *J, MCode **lim)
{
  if (!J->mcarea)
    mcode_allocarea(J);
  else
    mcode_protect(J, MCPROT_GEN);
  *lim = J->mcbot;
  return J->mctop;
}